

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O3

void __thiscall ConditionalExecution::execute(ConditionalExecution *this)

{
  PcodeOp *pPVar1;
  BlockBasic *pBVar2;
  _Self __tmp;
  _List_node_base *p_Var3;
  
  fixReturnOp(this);
  if (this->directsplit == false) {
    pBVar2 = this->iblock;
    p_Var3 = (pBVar2->op).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)&pBVar2->op) {
      pPVar1 = (PcodeOp *)p_Var3[1]._M_next;
      p_Var3 = p_Var3->_M_next;
      if ((pPVar1->flags & 2) == 0) {
        doReplacement(this,pPVar1);
      }
      Funcdata::opDestroy(this->fd,pPVar1);
      pBVar2 = this->iblock;
    }
    Funcdata::removeFromFlowSplit(this->fd,pBVar2,this->posta_outslot != this->camethruposta_slot);
    return;
  }
  adjustDirectMulti(this);
  pBVar2 = this->iblock;
  p_Var3 = (pBVar2->op).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&pBVar2->op) {
    pPVar1 = (PcodeOp *)p_Var3[1]._M_next;
    p_Var3 = p_Var3->_M_next;
    if (pPVar1->opcode->opcode == CPUI_MULTIEQUAL) {
      doReplacement(this,pPVar1);
      Funcdata::opDestroy(this->fd,pPVar1);
      pBVar2 = this->iblock;
    }
  }
  Funcdata::switchEdge
            (this->fd,(pBVar2->super_FlowBlock).intothis.
                      super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                      super__Vector_impl_data._M_start[this->camethruposta_slot].point,pBVar2,
             &this->posta_block->super_FlowBlock);
  return;
}

Assistant:

void ConditionalExecution::execute(void)

{
  list<PcodeOp *>::iterator iter;
  PcodeOp *op;

  fixReturnOp();		// Patch any data-flow thru to CPUI_RETURN
  if (!directsplit) {
    iter = iblock->beginOp();
    while(iter != iblock->endOp()) {
      op = *iter++;
      if (!op->isBranch())
	doReplacement(op);	// Remove all read refs of op
      fd->opDestroy(op);	// Then destroy op
    }
    fd->removeFromFlowSplit(iblock,(posta_outslot != camethruposta_slot));
  }
  else {
    adjustDirectMulti();
    iter = iblock->beginOp();
    while(iter != iblock->endOp()) {
      op = *iter++;
      if (op->code() == CPUI_MULTIEQUAL) { // Only adjust MULTIEQUALs
	doReplacement(op);
	fd->opDestroy(op);
      }
      // Branch stays, other operations stay
    }
    fd->switchEdge(iblock->getIn(camethruposta_slot),iblock,posta_block);
  }
}